

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall helics::CommonCore::getLocalEndpoint(CommonCore *this,string_view name)

{
  BasicHandleInfo *pBVar1;
  shared_mutex *__rwlock;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  pBVar1 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,name,ENDPOINT);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)pBVar1;
}

Assistant:

const BasicHandleInfo* CommonCore::getLocalEndpoint(std::string_view name) const
{
    return handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::ENDPOINT); });
}